

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O3

uint32_t __thiscall
Bitmap::drawBarcode(Bitmap *this,uint32_t x,uint32_t y,uint32_t weight,uint32_t height,
                   uint32_t value)

{
  byte bVar1;
  byte bVar2;
  uint32_t uVar3;
  uint uVar4;
  byte bVar5;
  byte bVar6;
  uint32_t uVar7;
  uint uVar8;
  uint uVar9;
  uint8_t barcode [9];
  byte local_39 [9];
  
  if (height == 0) {
    uVar3 = 0;
  }
  else {
    uVar3 = BarcodeEan8::intToBarcode(value,local_39);
    if (uVar3 != 0) {
      uVar8 = 0;
      do {
        if (weight != 0) {
          bVar1 = local_39[uVar8 >> 3];
          uVar7 = weight;
          do {
            uVar4 = getPixelIndex(this,x,y);
            if (uVar4 < (uint)this->length) {
              bVar5 = (byte)uVar4 & 7;
              uVar9 = uVar4 + 7;
              if (-1 < (int)uVar4) {
                uVar9 = uVar4;
              }
              bVar2 = this->data[(int)uVar9 >> 3];
              bVar6 = (byte)(0x80 >> bVar5) | bVar2;
              if ((0x80U >> ((byte)uVar8 & 7) & (uint)bVar1) == 0) {
                bVar6 = (byte)(-0x81 >> bVar5) & bVar2;
              }
              this->data[(int)uVar9 >> 3] = bVar6;
            }
            x = x + 1;
            uVar7 = uVar7 - 1;
          } while (uVar7 != 0);
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 != uVar3);
    }
    duplicateLineDown(this,y,height - 1);
    uVar3 = uVar3 * weight;
  }
  return uVar3;
}

Assistant:

uint32_t Bitmap::drawBarcode(uint32_t x, uint32_t y, uint32_t weight, uint32_t height, uint32_t value)
{
   if (height > 0)
   {
      uint8_t barcode[9];
      uint32_t barcodeLength;
      uint32_t cursor;
      uint32_t pixel;

      //get encode barcode
      barcodeLength = BarcodeEan8::intToBarcode(value, barcode);
      //draw one barcode line
      cursor = x;
      for (uint32_t i = 0; i < barcodeLength; ++i)
      {
         bool value = ((barcode[i/8] & (0x80 >> (i & 7))) != 0); //get respective bit
         for (uint32_t j = 0; j < weight; ++j)
         {
            pixel = getPixelIndex(cursor++, y);
            setPixelValue(pixel, value);
         }
      }

      //duplicate that line (height - 1)-times
      duplicateLineDown(y, height - 1);
      return weight * barcodeLength;
   }
   return 0;
}